

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small_alloc.c
# Opt level: O0

void small_alloc_low_alloc_factor(void)

{
  void *pvVar1;
  void *pvVar2;
  int local_2c4;
  int i_1;
  void *ptr;
  int i;
  void **allocations;
  int alloc_count;
  uint alloc_size;
  float actual_alloc_factor;
  quota quota1;
  slab_cache cache1;
  slab_arena arena1;
  
  plan(1);
  _space(_stdout);
  printf("# *** %s ***\n","small_alloc_low_alloc_factor");
  quota_init((quota *)&alloc_size,0x100000);
  slab_arena_create((slab_arena *)&cache1.thread_id,(quota *)&alloc_size,0,4000000,2);
  slab_cache_create((slab_cache *)&quota1,(slab_arena *)&cache1.thread_id);
  small_alloc_create(&alloc,(slab_cache *)&quota1,0xc,8,1.001,(float *)&alloc_count);
  if (alloc.small_mempool_cache_size != 0x400) {
    fprintf(_stderr,"Test failed: %s is %s at %s:%d, in function \'%s\'\n",
            "alloc.small_mempool_cache_size == SMALL_MEMPOOL_MAX","false",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/small_alloc.c"
            ,0xd7,"small_alloc_low_alloc_factor");
    exit(-1);
  }
  if (0x3ff < alloc.objsize_max) {
    pvVar1 = calloc(0x400,8);
    if (pvVar1 != (void *)0x0) {
      ptr._4_4_ = 0;
      while ((ptr._4_4_ < 0x400 && (pvVar2 = smalloc(&alloc,0x400), pvVar2 != (void *)0x0))) {
        *(void **)((long)pvVar1 + (long)ptr._4_4_ * 8) = pvVar2;
        ptr._4_4_ = ptr._4_4_ + 1;
      }
      local_2c4 = 0;
      while ((local_2c4 < 0x400 && (*(long *)((long)pvVar1 + (long)local_2c4 * 8) != 0))) {
        smfree(&alloc,*(void **)((long)pvVar1 + (long)local_2c4 * 8),0x400);
        local_2c4 = local_2c4 + 1;
      }
      small_alloc_destroy(&alloc);
      slab_cache_destroy((slab_cache *)&quota1);
      slab_arena_destroy((slab_arena *)&cache1.thread_id);
      _ok(1,"true",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/small_alloc.c",
          0xee,"line %d");
      _space(_stdout);
      printf("# *** %s: done ***\n","small_alloc_low_alloc_factor");
      check_plan();
      return;
    }
    fprintf(_stderr,"Test failed: %s is %s at %s:%d, in function \'%s\'\n","allocations != NULL",
            "false",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/small_alloc.c"
            ,0xdc,"small_alloc_low_alloc_factor");
    exit(-1);
  }
  fprintf(_stderr,"Test failed: %s is %s at %s:%d, in function \'%s\'\n",
          "alloc_size <= alloc.objsize_max","false",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/small_alloc.c",
          0xd9,"small_alloc_low_alloc_factor");
  exit(-1);
}

Assistant:

static void
small_alloc_low_alloc_factor()
{
	plan(1);
	header();

	struct slab_arena arena1;
	struct slab_cache cache1;
	struct quota quota1;

	quota_init(&quota1, 1024 * 1024);
	slab_arena_create(&arena1, &quota1, 0, 4000000, MAP_PRIVATE);
	slab_cache_create(&cache1, &arena1);

	float actual_alloc_factor;
	small_alloc_create(&alloc, &cache1, OBJSIZE_MIN,
			   sizeof(intptr_t), 1.001,
			   &actual_alloc_factor);
	const unsigned alloc_size = 1024;
	const int alloc_count = 1024;
	/* Make sure we in mode when all mempools are used. */
	fail_unless(alloc.small_mempool_cache_size == SMALL_MEMPOOL_MAX);
	/* Make sure we allocate from pools. */
	fail_unless(alloc_size <= alloc.objsize_max);

	void **allocations = calloc(alloc_count, sizeof(void *));
	fail_unless(allocations != NULL);

	for (int i = 0; i < alloc_count; i++) {
		void *ptr = smalloc(&alloc, alloc_size);
		if (ptr == NULL)
			break;
		allocations[i] = ptr;
	}
	for (int i = 0; i < alloc_count; i++) {
		if (allocations[i] == NULL)
			break;
		smfree(&alloc, allocations[i], alloc_size);
	}

	small_alloc_destroy(&alloc);
	slab_cache_destroy(&cache1);
	slab_arena_destroy(&arena1);

	ok(true);

	footer();
	check_plan();
}